

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestRegistry.cpp
# Opt level: O2

UtestShell * __thiscall TestRegistry::findTestWithName(TestRegistry *this,SimpleString *name)

{
  bool bVar1;
  int iVar2;
  undefined4 extraout_var;
  UtestShell *pUVar3;
  
  pUVar3 = this->tests_;
  while( true ) {
    if (pUVar3 == (UtestShell *)0x0) {
      return (UtestShell *)0x0;
    }
    UtestShell::getName((UtestShell *)&stack0xffffffffffffffd0);
    bVar1 = operator==((SimpleString *)&stack0xffffffffffffffd0,name);
    SimpleString::~SimpleString((SimpleString *)&stack0xffffffffffffffd0);
    if (bVar1) break;
    iVar2 = (*pUVar3->_vptr_UtestShell[3])(pUVar3);
    pUVar3 = (UtestShell *)CONCAT44(extraout_var,iVar2);
  }
  return pUVar3;
}

Assistant:

UtestShell* TestRegistry::findTestWithName(const SimpleString& name)
{
    UtestShell* current = tests_;
    while (current) {
        if (current->getName() == name)
            return current;
        current = current->getNext();
    }
    return NULLPTR;
}